

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getWorldBaseTransform
          (KinDynComputations *this,MatrixView<double> *world_T_base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  pointer peVar5;
  Index row;
  long lVar6;
  pointer peVar7;
  Index col;
  long lVar8;
  undefined1 *puVar9;
  bool bVar10;
  bool bVar11;
  undefined1 local_98 [128];
  
  puVar9 = local_98;
  if (world_T_base->m_rows == 4) {
    bVar10 = world_T_base->m_cols == 4;
  }
  else {
    bVar10 = false;
  }
  if (bVar10 == false) {
    iDynTree::reportError
              ("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
  }
  else {
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::asHomogeneousTransform();
    bVar11 = world_T_base->m_storageOrder == ColumnMajor;
    lVar1 = world_T_base->m_rows;
    lVar4 = 1;
    if (bVar11) {
      lVar4 = lVar1;
    }
    lVar2 = world_T_base->m_cols;
    lVar3 = 1;
    if (!bVar11) {
      lVar3 = lVar2;
    }
    if (0 < lVar1) {
      peVar5 = world_T_base->m_storage;
      lVar6 = 0;
      do {
        if (0 < lVar2) {
          lVar8 = 0;
          peVar7 = peVar5;
          do {
            *peVar7 = *(element_type *)(puVar9 + lVar8 * 8);
            lVar8 = lVar8 + 1;
            peVar7 = peVar7 + lVar4;
          } while (lVar2 != lVar8);
        }
        lVar6 = lVar6 + 1;
        puVar9 = puVar9 + 0x20;
        peVar5 = peVar5 + lVar3;
      } while (lVar6 != lVar1);
    }
  }
  return bVar10;
}

Assistant:

bool KinDynComputations::getWorldBaseTransform(iDynTree::MatrixView<double> world_T_base) const
{
    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
        return false;
    }

    toEigen(world_T_base) = toEigen(this->pimpl->m_pos.worldBasePos().asHomogeneousTransform());

    return true;
}